

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
::find_position<HashObject<4,4>*>
          (sparse_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
           *this,HashObject<4,_4> **key)

{
  long lVar1;
  bool bVar2;
  const_reference ppVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  
  lVar1 = *(long *)(this + 0x48);
  uVar7 = (ulong)*key >> 3;
  uVar5 = 0xffffffffffffffff;
  lVar8 = 0;
  do {
    uVar7 = uVar7 & lVar1 - 1U;
    lVar6 = (uVar7 / 0x30) * 0x10;
    uVar4 = uVar7 % 0x30;
    if ((*(byte *)((uVar4 >> 3) + 10 + *(long *)(this + 0x30) + lVar6) >> ((uint)uVar4 & 7) & 1) ==
        0) {
      uVar4 = uVar7;
      if (uVar5 != 0xffffffffffffffff) {
        uVar4 = uVar5;
      }
      uVar7 = 0xffffffffffffffff;
LAB_0012a498:
      pVar9.second = uVar4;
      pVar9.first = uVar7;
      return pVar9;
    }
    bVar2 = sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
            ::test_deleted((sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                            *)this,uVar7);
    if (bVar2) {
      if (uVar5 == 0xffffffffffffffff) {
        uVar5 = uVar7;
      }
    }
    else {
      ppVar3 = sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
               ::unsafe_get((sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                             *)(lVar6 + *(long *)(this + 0x30)),(size_type_conflict)uVar4);
      if (*key == ppVar3->first) {
        uVar4 = 0xffffffffffffffff;
        goto LAB_0012a498;
      }
    }
    uVar7 = uVar7 + lVar8 + 1;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }